

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

void __thiscall
chrono::ChSystemDescriptor::ConstraintsProject
          (ChSystemDescriptor *this,ChVectorDynamic<> *multipliers)

{
  pointer ppCVar1;
  pointer ppCVar2;
  ChConstraint *pCVar3;
  size_t ic;
  long lVar4;
  
  (*this->_vptr_ChSystemDescriptor[0x13])();
  ppCVar1 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar2 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (lVar4 = 0; (long)ppCVar1 - (long)ppCVar2 >> 3 != lVar4; lVar4 = lVar4 + 1) {
    pCVar3 = (this->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar4];
    if (pCVar3->active == true) {
      (*pCVar3->_vptr_ChConstraint[0xb])();
    }
  }
  (*this->_vptr_ChSystemDescriptor[0x12])(this,multipliers,0);
  return;
}

Assistant:

void ChSystemDescriptor::ConstraintsProject(ChVectorDynamic<>& multipliers) {
    FromVectorToConstraints(multipliers);

    auto vc_size = vconstraints.size();

    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive())
            vconstraints[ic]->Project();
    }

    FromConstraintsToVector(multipliers, false);
}